

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O3

void __thiscall
Memory::LargeHeapBlock::FillFreeMemory
          (LargeHeapBlock *this,Recycler *recycler,void *address,size_t size)

{
  HeapBlockType HVar1;
  PageHeapData *pPVar2;
  HeapInfo *this_00;
  IdleDecommitPageAllocator *pIVar3;
  int __c;
  
  __c = 0xca;
  if (recycler->verifyEnabled == false) {
    __c = 0xfe;
  }
  pPVar2 = this->pageHeapData;
  if (((pPVar2 != (PageHeapData *)0x0) && (pPVar2->pageHeapMode != PageHeapModeOff)) &&
     (pPVar2->isLockedWithPageHeap == true)) {
    PageHeapUnLockPages(this);
  }
  memset(address,__c,size);
  if (this->pageHeapData == (PageHeapData *)0x0) {
    return;
  }
  if (this->pageHeapData->pageHeapMode == PageHeapModeOff) {
    return;
  }
  this_00 = this->heapInfo;
  HVar1 = (this->super_HeapBlock).heapBlockType;
  if (HVar1 < 0xc) {
    if ((0x630U >> (HVar1 & 0x1f) & 1) != 0) {
      pIVar3 = HeapInfo::GetRecyclerWithBarrierPageAllocator(this_00);
      goto LAB_006e925c;
    }
    if ((0x84U >> (HVar1 & 0x1f) & 1) != 0) {
      pIVar3 = HeapInfo::GetRecyclerLeafPageAllocator(this_00);
      goto LAB_006e925c;
    }
    if (HVar1 == 0xb) {
      pIVar3 = HeapInfo::GetRecyclerLargeBlockPageAllocator(this_00);
      goto LAB_006e925c;
    }
  }
  pIVar3 = HeapInfo::GetRecyclerPageAllocator(this_00);
LAB_006e925c:
  if ((pIVar3->super_PageAllocator).disablePageReuse != true) {
    return;
  }
  PageHeapLockPages(this);
  return;
}

Assistant:

void LargeHeapBlock::FillFreeMemory(Recycler * recycler, __in_bcount(size) void * address, size_t size)
{
    // For now, we don't do anything in release build because we don't reuse this memory until we return
    // the pages to the allocator which will zero out the whole page
    byte memFill = 0;
    bool doMemFill = false;

#ifdef RECYCLER_FREE_MEM_FILL
    memFill = DbgMemFill;
    doMemFill = true;
#endif

#ifdef RECYCLER_MEMORY_VERIFY
    if (recycler->VerifyEnabled())
    {
        memFill = Recycler::VerifyMemFill;
        doMemFill = true;
    }
#endif

#if defined(RECYCLER_FREE_MEM_FILL) || defined(RECYCLER_MEMORY_VERIFY)
    if (doMemFill)
    {
        if (this->InPageHeapMode() && pageHeapData->isLockedWithPageHeap) 
        {
            PageHeapUnLockPages();
        }
        memset(address, memFill, size);
    }
#endif

#if defined(RECYCLER_NO_PAGE_REUSE)
    if (this->InPageHeapMode() && this->GetPageAllocator(this->heapInfo)->IsPageReuseDisabled())
    {
        this->PageHeapLockPages();
    }
#endif
}